

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.h
# Opt level: O2

void __thiscall RigidBodyDynamics::Constraint::~Constraint(Constraint *this)

{
  this->_vptr_Constraint = (_func_int **)&PTR___cxa_pure_virtual_0027cc38;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->velocityConstraint).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->positionConstraint).super__Bvector_base<std::allocator<bool>_>);
  std::
  _Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::~_Vector_base((_Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   *)&this->bodyFrames);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->bodyIds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~Constraint(){}